

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void ParseStructMember(CStructure *st)

{
  char cVar1;
  int noffset;
  bool bVar2;
  EStructureMembers EVar3;
  int iVar4;
  uint uVar5;
  char *naam;
  CStructure *st_00;
  byte *data;
  CStructureEntry2 *pCVar6;
  ulong __n;
  EType EVar7;
  aint len;
  char *pp;
  char *structName;
  char warnTxt [2048];
  uint local_840;
  uint local_83c;
  char *local_838;
  char *local_830;
  int local_828 [512];
  
  bp = lp;
  Relocation::isResultAffected = '\0';
  EVar3 = GetStructMemberId(&lp);
  switch(EVar3) {
  case SMEMBALIGN:
    ParseAlignArguments(&lp,local_828,(aint *)&local_838);
    iVar4 = 4;
    if (local_828[0] != -1) {
      iVar4 = local_828[0];
    }
    if (st->maxAlignment < iVar4) {
      st->maxAlignment = iVar4;
    }
    noffset = st->noffset;
    uVar5 = iVar4 - 1U & -noffset;
    if ((int)uVar5 < 1) goto LAB_001224f2;
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,noffset,uVar5,(aint)local_838,OFF,SMEMBBLOCK);
    break;
  case SMEMBBYTE:
    uVar5 = ParseExpression(&lp,(aint *)&local_840);
    if (uVar5 != 0) {
      uVar5 = local_840;
    }
    check8(uVar5);
    EVar7 = OFF;
    if (Relocation::isResultAffected != '\0') {
      EVar7 = Relocation::deltaType;
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,1,uVar5,EVar7,SMEMBBYTE);
    CStructure::AddMember(st,pCVar6);
    EVar7 = HIGH;
    goto LAB_00122360;
  case SMEMBWORD:
    uVar5 = ParseExpression(&lp,(aint *)&local_840);
    if (uVar5 != 0) {
      uVar5 = local_840;
    }
    check16(uVar5);
    EVar7 = OFF;
    if (Relocation::isResultAffected != '\0') {
      EVar7 = Relocation::deltaType;
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,2,uVar5,EVar7,SMEMBWORD);
    CStructure::AddMember(st,pCVar6);
    EVar7 = REGULAR;
LAB_00122360:
    Relocation::resolveRelocationAffected(0x7fffffff,EVar7);
    goto LAB_001224f2;
  case SMEMBBLOCK:
    iVar4 = ParseExpression(&lp,(aint *)&local_83c);
    if (iVar4 == 0) {
      local_83c = 1;
      Error("[STRUCT] Expression expected",(char *)0x0,PASS3);
    }
    bVar2 = comma(&lp);
    uVar5 = 0xffffffff;
    if (bVar2) {
      iVar4 = ParseExpression(&lp,(aint *)&local_840);
      uVar5 = local_840;
      if (iVar4 == 0) {
        Error("[STRUCT] Expression expected",(char *)0x0,PASS3);
        uVar5 = 0;
      }
      check8(uVar5);
      uVar5 = uVar5 & 0xff;
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,local_83c,uVar5,OFF,SMEMBBLOCK);
    break;
  case SMEMBDWORD:
    uVar5 = ParseExpression(&lp,(aint *)&local_840);
    if (uVar5 != 0) {
      uVar5 = local_840;
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,4,uVar5,OFF,SMEMBDWORD);
    break;
  case SMEMBD24:
    uVar5 = ParseExpression(&lp,(aint *)&local_840);
    if (uVar5 != 0) {
      uVar5 = local_840;
    }
    check24(uVar5);
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,3,uVar5,OFF,SMEMBD24);
    break;
  case SMEMBTEXT:
    iVar4 = ParseExpression(&lp,(aint *)&local_83c);
    uVar5 = local_83c;
    if (local_83c - 0x2001 < 0xffffe000 || iVar4 == 0) {
      Error("[STRUCT] Expression for length of text expected (1..8192)",(char *)0x0,PASS3);
      SkipToEol(&lp);
      goto LAB_001224f2;
    }
    __n = (ulong)local_83c;
    data = (byte *)operator_new__(__n);
    memset(data,0,__n);
    bVar2 = comma(&lp);
    if (bVar2) {
      GetStructText(&lp,uVar5,data,(byte *)0x0);
    }
    else {
      iVar4 = SkipBlanks(&lp);
      if (iVar4 == 0) {
        Error("[STRUCT] Comma expected",lp,SUPPRESS);
      }
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,uVar5,data);
    break;
  default:
    local_838 = lp;
    SkipBlanks(&local_838);
    cVar1 = *local_838;
    if (cVar1 == '@') {
      local_838 = local_838 + 1;
    }
    naam = GetID(&local_838);
    if ((naam != (char *)0x0) &&
       (st_00 = CStructureTable::zoek(&StructureTable,naam,(uint)(cVar1 == '@')),
       st_00 != (CStructure *)0x0)) {
      local_830 = st->naam;
      iVar4 = cmphstr(&local_830,naam,false);
      if (iVar4 == 0) {
        if ((st_00->maxAlignment != 0) && ((st_00->maxAlignment - 1U & -st->noffset) != 0)) {
          snprintf((char *)local_828,0x800,
                   "Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes"
                   ,st_00->naam);
          Warning((char *)local_828,(char *)0x0,W_PASS3);
        }
        lp = local_838;
        CStructure::CopyLabels(st,st_00);
        CStructure::CopyMembers(st,st_00,&lp);
      }
      else {
        Error("[STRUCT] Can\'t include itself",(char *)0x0,PASS3);
        SkipToEol(&local_838);
        lp = local_838;
      }
    }
    goto LAB_001224f2;
  }
  CStructure::AddMember(st,pCVar6);
LAB_001224f2:
  Relocation::checkAndWarn(false);
  return;
}

Assistant:

void ParseStructMember(CStructure* st) {
	aint val, len;
	bp = lp;
	Relocation::isResultAffected = false;
	Relocation::EType deltaType = Relocation::OFF;
	switch (GetStructMemberId(lp)) {
	case SMEMBBLOCK:
		if (!ParseExpression(lp, len)) {
			len = 1;
			Error("[STRUCT] Expression expected");
		}
		if (comma(lp)) {
			if (!ParseExpression(lp, val)) {
				val = 0;
				Error("[STRUCT] Expression expected");
			}
			check8(val);
			val &= 255;
		} else {
			val = -1;
		}
		st->AddMember(new CStructureEntry2(st->noffset, len, val, deltaType, SMEMBBLOCK));
		break;
	case SMEMBBYTE:
		if (!ParseExpression(lp, val)) val = 0;
		check8(val);
		deltaType = Relocation::isResultAffected ? Relocation::deltaType : Relocation::OFF;
		st->AddMember(new CStructureEntry2(st->noffset, 1, val, deltaType, SMEMBBYTE));
		Relocation::resolveRelocationAffected(INT_MAX, Relocation::HIGH);	// clear flags + warn when can't be relocated
		break;
	case SMEMBWORD:
		if (!ParseExpression(lp, val)) val = 0;
		check16(val);
		deltaType = Relocation::isResultAffected ? Relocation::deltaType : Relocation::OFF;
		st->AddMember(new CStructureEntry2(st->noffset, 2, val, deltaType, SMEMBWORD));
		Relocation::resolveRelocationAffected(INT_MAX);	// clear flags + warn when can't be relocated
		break;
	case SMEMBD24:
		if (!ParseExpression(lp, val)) val = 0;
		check24(val);
		st->AddMember(new CStructureEntry2(st->noffset, 3, val, deltaType, SMEMBD24));
		break;
	case SMEMBDWORD:
		if (!ParseExpression(lp, val)) val = 0;
		st->AddMember(new CStructureEntry2(st->noffset, 4, val, deltaType, SMEMBDWORD));
		break;
	case SMEMBTEXT:
		{
			if (!ParseExpression(lp, len) || len < 1 || CStructureEntry2::TEXT_MAX_SIZE < len) {
				Error("[STRUCT] Expression for length of text expected (1..8192)");
				SkipToEol(lp);
				break;
			}
			byte* textData = new byte[len]();	// zero-initialized for stable binary results
			if (nullptr == textData) ErrorOOM();
			if (comma(lp)) {		// if comma then init data array explicitly
				GetStructText(lp, len, textData);
			} else if (SkipBlanks(lp)) {
				// if empty without comma, init with the zeroed values
			} else {
				Error("[STRUCT] Comma expected", lp, SUPPRESS);	// syntax error
			}
			st->AddMember(new CStructureEntry2(st->noffset, len, textData));
		}
		break;
	case SMEMBALIGN:
	{
		aint val, fill;
		ParseAlignArguments(lp, val, fill);
		if (-1 == val) val = 4;
		if (st->maxAlignment < val) st->maxAlignment = val;	// update structure "max alignment"
		aint bytesToAdvance = (~st->noffset + 1) & (val - 1);
		if (bytesToAdvance < 1) break;		// already aligned, nothing to do
		// create alignment block
		st->AddMember(new CStructureEntry2(st->noffset, bytesToAdvance, fill, deltaType, SMEMBBLOCK));
		break;
	}
	default:
		char* pp = lp,* n;
		int gl = 0;
		CStructure* s;
		SkipBlanks(pp);
		if (*pp == '@') {
			++pp;
			gl = 1;
		}
		if ((n = GetID(pp)) && (s = StructureTable.zoek(n, gl))) {
			char* structName = st->naam;	// need copy of pointer so cmphstr can advance it in case of match
			if (cmphstr(structName, n)) {
				Error("[STRUCT] Can't include itself", NULL);
				SkipToEol(pp);
				lp = pp;
				break;
			}
			if (s->maxAlignment && ((~st->noffset + 1) & (s->maxAlignment - 1))) {
				// Inserted structure did use ALIGN in definition and it is misaligned here
				char warnTxt[LINEMAX];
				SPRINTF3(warnTxt, LINEMAX,
						 "Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes",
						 s->naam, s->maxAlignment, ((~st->noffset + 1) & (s->maxAlignment - 1)));
				Warning(warnTxt);
			}
			lp = pp;
			st->CopyLabels(s);
			st->CopyMembers(s, lp);
		}
		break;
	}
	Relocation::checkAndWarn();
}